

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__vertical_flip_slices(void *image,int w,int h,int z,int bytes_per_pixel)

{
  int in_ECX;
  stbi_uc *bytes;
  int slice_size;
  int slice;
  int in_stack_00000814;
  int in_stack_00000818;
  int in_stack_0000081c;
  void *in_stack_00000820;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ECX; local_1c = local_1c + 1) {
    stbi__vertical_flip(in_stack_00000820,in_stack_0000081c,in_stack_00000818,in_stack_00000814);
  }
  return;
}

Assistant:

static void stbi__vertical_flip_slices(void *image, int w, int h, int z, int bytes_per_pixel)
{
   int slice;
   int slice_size = w * h * bytes_per_pixel;

   stbi_uc *bytes = (stbi_uc *)image;
   for (slice = 0; slice < z; ++slice) {
      stbi__vertical_flip(bytes, w, h, bytes_per_pixel);
      bytes += slice_size;
   }
}